

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  char *pcVar1;
  byte *pbVar2;
  char *pcVar3;
  char *pcVar4;
  byte bVar5;
  char cVar6;
  ulong uVar7;
  undefined8 uVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  LZ4_byte *pLVar12;
  long lVar13;
  size_t sVar14;
  char *pcVar15;
  char *pcVar16;
  ushort *puVar17;
  char *pcVar18;
  BYTE *d;
  char *pcVar19;
  ushort *puVar20;
  ushort *__src;
  BYTE *s;
  BYTE *d_1;
  char *pcVar21;
  ulong uVar22;
  char *__src_00;
  ulong __n;
  int local_68;
  int local_50;
  
  uVar22 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar22 == 0) {
    uVar11 = LZ4_decompress_safe(source,dest,compressedSize,maxOutputSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
      if (uVar22 < 0xffff) {
        uVar7 = (LZ4_streamDecode->internal_donotuse).extDictSize;
        if (uVar7 != 0) {
          if (maxOutputSize < 0 || source == (char *)0x0) {
            return -1;
          }
          pLVar12 = (LZ4_streamDecode->internal_donotuse).externalDict + uVar7;
          if ((LZ4_streamDecode->internal_donotuse).externalDict == (LZ4_byte *)0x0) {
            pLVar12 = (LZ4_byte *)0x0;
          }
          if (maxOutputSize == 0) {
            if (compressedSize != 1) {
              return -1;
            }
            return -(uint)(*source != '\0');
          }
          if (compressedSize == 0) {
            return -1;
          }
          __src_00 = dest + -uVar22;
          pbVar2 = (byte *)(source + compressedSize);
          pcVar3 = dest + (uint)maxOutputSize;
          pcVar1 = pcVar3 + -7;
          pcVar19 = dest;
          puVar20 = (ushort *)source;
LAB_0029b4c7:
          __src = (ushort *)((long)puVar20 + 1);
          bVar5 = (byte)*puVar20;
          sVar14 = (size_t)(uint)(bVar5 >> 4);
          if (bVar5 >> 4 == 0xf) {
            if (pbVar2 + -0xf <= __src) goto LAB_0029b877;
            puVar20 = puVar20 + 1;
            lVar13 = 0;
            puVar17 = __src;
            do {
              __src = (ushort *)((long)puVar17 + 1);
              if (pbVar2 + -0xf < __src) goto LAB_0029b877;
              uVar9 = *puVar17;
              lVar13 = lVar13 + (ulong)(byte)uVar9;
              puVar20 = (ushort *)((long)puVar20 + 1);
              puVar17 = __src;
            } while ((ulong)(byte)uVar9 == 0xff);
            if (((lVar13 == -1) || (sVar14 = lVar13 + 0xf, CARRY8((ulong)pcVar19,sVar14))) ||
               ((ulong)-(long)puVar20 < sVar14)) goto LAB_0029b877;
LAB_0029b539:
            pcVar21 = pcVar19 + sVar14;
            if ((pcVar3 + -0xc < pcVar21) ||
               (puVar20 = (ushort *)((long)__src + sVar14), pbVar2 + -8 < puVar20)) {
              if (((byte *)((long)__src + sVar14) == pbVar2) && (pcVar21 <= pcVar3)) {
                memmove(pcVar19,__src,sVar14);
                local_68 = (int)dest;
                uVar11 = (int)pcVar21 - local_68;
                goto LAB_0029b828;
              }
LAB_0029b877:
              local_50 = (int)source;
              uVar11 = ~(uint)__src + local_50;
              goto LAB_0029b828;
            }
            do {
              *(undefined8 *)pcVar19 = *(undefined8 *)__src;
              pcVar19 = pcVar19 + 8;
              __src = __src + 4;
            } while (pcVar19 < pcVar21);
            uVar9 = *puVar20;
            __src = puVar20 + 1;
            pcVar15 = pcVar21 + -(ulong)uVar9;
            uVar22 = (ulong)(bVar5 & 0xf);
          }
          else {
            if ((source + (long)compressedSize + -0x10 <= __src) ||
               (dest + ((ulong)(uint)maxOutputSize - 0x20) < pcVar19)) goto LAB_0029b539;
            uVar8 = *(undefined8 *)((long)puVar20 + 9);
            *(undefined8 *)pcVar19 = *(undefined8 *)__src;
            *(undefined8 *)(pcVar19 + 8) = uVar8;
            pcVar21 = pcVar19 + sVar14;
            uVar22 = (ulong)(bVar5 & 0xf);
            puVar20 = (ushort *)((long)__src + sVar14);
            __src = puVar20 + 1;
            uVar9 = *puVar20;
            pcVar15 = pcVar21 + -(ulong)uVar9;
            if (((uVar22 != 0xf) && (7 < uVar9)) && (__src_00 <= pcVar15)) {
              *(undefined8 *)pcVar21 = *(undefined8 *)pcVar15;
              *(undefined8 *)(pcVar21 + 8) = *(undefined8 *)(pcVar15 + 8);
              *(undefined2 *)(pcVar21 + 0x10) = *(undefined2 *)(pcVar15 + 0x10);
              pcVar19 = pcVar21 + uVar22 + 4;
              puVar20 = __src;
              goto LAB_0029b4c7;
            }
          }
          if ((int)uVar22 == 0xf) {
            lVar13 = 0;
            puVar20 = __src;
            do {
              __src = (ushort *)((long)puVar20 + 1);
              if (pbVar2 + -4 < __src) goto LAB_0029b877;
              uVar10 = *puVar20;
              lVar13 = lVar13 + (ulong)(byte)uVar10;
              puVar20 = __src;
            } while ((ulong)(byte)uVar10 == 0xff);
            uVar22 = lVar13 + 0xf;
            if ((lVar13 == -1) || (CARRY8((ulong)pcVar21,uVar22))) goto LAB_0029b877;
          }
          if ((uVar7 < 0x10000) && (pcVar15 + uVar7 < __src_00)) goto LAB_0029b877;
          sVar14 = uVar22 + 4;
          pcVar4 = pcVar21 + sVar14;
          pcVar19 = pcVar4;
          puVar20 = __src;
          if (pcVar15 < __src_00) {
            if (pcVar3 + -5 < pcVar4) goto LAB_0029b877;
            __n = (long)__src_00 - (long)pcVar15;
            uVar22 = sVar14 - __n;
            if (sVar14 < __n || uVar22 == 0) {
              memmove(pcVar21,pLVar12 + -__n,sVar14);
            }
            else {
              memcpy(pcVar21,pLVar12 + -__n,__n);
              pcVar19 = pcVar21 + __n;
              pcVar21 = __src_00;
              if ((ulong)((long)pcVar19 - (long)__src_00) < uVar22) {
                for (; pcVar19 < pcVar4; pcVar19 = pcVar19 + 1) {
                  *pcVar19 = *pcVar21;
                  pcVar21 = pcVar21 + 1;
                }
              }
              else {
                memcpy(pcVar19,__src_00,uVar22);
                pcVar19 = pcVar4;
              }
            }
          }
          else {
            if (uVar9 < 8) {
              pcVar21[0] = '\0';
              pcVar21[1] = '\0';
              pcVar21[2] = '\0';
              pcVar21[3] = '\0';
              *pcVar21 = *pcVar15;
              pcVar21[1] = pcVar15[1];
              pcVar21[2] = pcVar15[2];
              pcVar21[3] = pcVar15[3];
              uVar11 = inc32table[uVar9];
              *(undefined4 *)(pcVar21 + 4) = *(undefined4 *)(pcVar15 + uVar11);
              pcVar15 = pcVar15 + ((ulong)uVar11 - (long)dec64table[uVar9]);
            }
            else {
              *(undefined8 *)pcVar21 = *(undefined8 *)pcVar15;
              pcVar15 = pcVar15 + 8;
            }
            pcVar16 = pcVar21 + 8;
            if (pcVar3 + -0xc < pcVar4) {
              if (pcVar3 + -5 < pcVar4) goto LAB_0029b877;
              pcVar21 = pcVar15;
              pcVar18 = pcVar16;
              if (pcVar16 < pcVar1) {
                do {
                  *(undefined8 *)pcVar18 = *(undefined8 *)pcVar21;
                  pcVar18 = pcVar18 + 8;
                  pcVar21 = pcVar21 + 8;
                } while (pcVar18 < pcVar1);
                pcVar15 = pcVar15 + ((long)pcVar1 - (long)pcVar16);
                pcVar16 = pcVar1;
              }
              for (; pcVar16 < pcVar4; pcVar16 = pcVar16 + 1) {
                cVar6 = *pcVar15;
                pcVar15 = pcVar15 + 1;
                *pcVar16 = cVar6;
              }
            }
            else {
              *(undefined8 *)pcVar16 = *(undefined8 *)pcVar15;
              if (0x10 < sVar14) {
                pcVar21 = pcVar21 + 0x10;
                do {
                  pcVar15 = pcVar15 + 8;
                  *(undefined8 *)pcVar21 = *(undefined8 *)pcVar15;
                  pcVar21 = pcVar21 + 8;
                } while (pcVar21 < pcVar4);
              }
            }
          }
          goto LAB_0029b4c7;
        }
        uVar11 = LZ4_decompress_safe_withSmallPrefix
                           (source,dest,compressedSize,maxOutputSize,uVar22);
      }
      else {
        uVar11 = LZ4_decompress_safe_withPrefix64k(source,dest,compressedSize,maxOutputSize);
      }
LAB_0029b828:
      if ((int)uVar11 < 1) {
        return uVar11;
      }
      (LZ4_streamDecode->internal_donotuse).prefixSize =
           (LZ4_streamDecode->internal_donotuse).prefixSize + (ulong)uVar11;
      (LZ4_streamDecode->internal_donotuse).prefixEnd =
           (LZ4_streamDecode->internal_donotuse).prefixEnd + uVar11;
      return uVar11;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar22;
    pLVar12 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -uVar22;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar12;
    uVar11 = LZ4_decompress_safe_forceExtDict
                       (source,dest,compressedSize,maxOutputSize,pLVar12,uVar22);
  }
  if (0 < (int)uVar11) {
    (LZ4_streamDecode->internal_donotuse).prefixSize = (ulong)uVar11;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + uVar11);
  }
  return uVar11;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;

    if (lz4sd->prefixSize == 0) {
        /* The first call, no dictionary yet. */
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd = (BYTE*)dest + result;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        /* They're rolling the current segment. */
        if (lz4sd->prefixSize >= 64 KB - 1)
            result = LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        else if (lz4sd->extDictSize == 0)
            result = LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize,
                                                         lz4sd->prefixSize);
        else
            result = LZ4_decompress_safe_doubleDict(source, dest, compressedSize, maxOutputSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)result;
        lz4sd->prefixEnd  += result;
    } else {
        /* The buffer wraps around, or they're switching to another buffer. */
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize,
                                                  lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}